

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-opcodecnt.cc
# Opt level: O0

void ParseOptions(int argc,char **argv)

{
  anon_class_1_0_00000001 local_191;
  Callback local_190;
  allocator local_169;
  string local_168 [39];
  anon_class_1_0_00000001 local_141;
  Callback local_140;
  anon_class_1_0_00000001 local_119;
  Callback local_118;
  anon_class_1_0_00000001 local_f1;
  Callback local_f0;
  anon_class_1_0_00000001 local_c9;
  NullCallback local_c8;
  undefined1 local_a8 [8];
  OptionParser parser;
  char **argv_local;
  int argc_local;
  
  parser.on_error_._M_invoker = (_Invoker_type)argv;
  wabt::OptionParser::OptionParser
            ((OptionParser *)local_a8,"wasm-opcodecnt",
             "  Read a file in the wasm binary format, and count opcode usage for\n  instructions.\n\nexamples:\n  # parse binary file test.wasm and write pcode dist file test.dist\n  $ wasm-opcodecnt test.wasm -o test.dist\n"
            );
  std::function<void()>::function<ParseOptions(int,char**)::__0,void>
            ((function<void()> *)&local_c8,&local_c9);
  wabt::OptionParser::AddOption
            ((OptionParser *)local_a8,'v',"verbose","Use multiple times for more info",&local_c8);
  std::function<void_()>::~function(&local_c8);
  wabt::Features::AddOptions(&s_features,(OptionParser *)local_a8);
  std::function<void(char_const*)>::function<ParseOptions(int,char**)::__1,void>
            ((function<void(char_const*)> *)&local_f0,&local_f1);
  wabt::OptionParser::AddOption
            ((OptionParser *)local_a8,'o',"output","FILENAME",
             "Output file for the opcode counts, by default use stdout",&local_f0);
  std::function<void_(const_char_*)>::~function(&local_f0);
  std::function<void(char_const*)>::function<ParseOptions(int,char**)::__2,void>
            ((function<void(char_const*)> *)&local_118,&local_119);
  wabt::OptionParser::AddOption
            ((OptionParser *)local_a8,'c',"cutoff","N","Cutoff for reporting counts less than N",
             &local_118);
  std::function<void_(const_char_*)>::~function(&local_118);
  std::function<void(char_const*)>::function<ParseOptions(int,char**)::__3,void>
            ((function<void(char_const*)> *)&local_140,&local_141);
  wabt::OptionParser::AddOption
            ((OptionParser *)local_a8,'s',"separator","SEPARATOR",
             "Separator text between element and count when reporting counts",&local_140);
  std::function<void_(const_char_*)>::~function(&local_140);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_168,"filename",&local_169);
  std::function<void(char_const*)>::function<ParseOptions(int,char**)::__4,void>
            ((function<void(char_const*)> *)&local_190,&local_191);
  wabt::OptionParser::AddArgument((OptionParser *)local_a8,(string *)local_168,OneOrMore,&local_190)
  ;
  std::function<void_(const_char_*)>::~function(&local_190);
  std::__cxx11::string::~string(local_168);
  std::allocator<char>::~allocator((allocator<char> *)&local_169);
  wabt::OptionParser::Parse((OptionParser *)local_a8,argc,(char **)parser.on_error_._M_invoker);
  wabt::OptionParser::~OptionParser((OptionParser *)local_a8);
  return;
}

Assistant:

static void ParseOptions(int argc, char** argv) {
  OptionParser parser("wasm-opcodecnt", s_description);

  parser.AddOption('v', "verbose", "Use multiple times for more info", []() {
    s_verbose++;
    s_log_stream = FileStream::CreateStderr();
    s_read_binary_options.log_stream = s_log_stream.get();
  });
  s_features.AddOptions(&parser);
  parser.AddOption('o', "output", "FILENAME",
                   "Output file for the opcode counts, by default use stdout",
                   [](const char* argument) { s_outfile = argument; });
  parser.AddOption(
      'c', "cutoff", "N", "Cutoff for reporting counts less than N",
      [](const std::string& argument) { s_cutoff = atol(argument.c_str()); });
  parser.AddOption(
      's', "separator", "SEPARATOR",
      "Separator text between element and count when reporting counts",
      [](const char* argument) { s_separator = argument; });
  parser.AddArgument("filename", OptionParser::ArgumentCount::OneOrMore,
                     [](const char* argument) { s_infile = argument; });
  parser.Parse(argc, argv);
}